

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.h
# Opt level: O0

workerInfo * __thiscall
parlay::scheduler<parlay::WorkStealingJob>::workerInfo::operator=(workerInfo *this,workerInfo *w)

{
  uint uVar1;
  scheduler<parlay::WorkStealingJob> *psVar2;
  workerInfo *in_RSI;
  workerInfo *in_RDI;
  void **in_stack_ffffffffffffffc8;
  scheduler<parlay::WorkStealingJob> **in_stack_ffffffffffffffd0;
  
  if (in_RDI != in_RSI) {
    uVar1 = std::exchange<unsigned_int,unsigned_int_const&>
                      ((uint *)in_stack_ffffffffffffffd0,(uint *)in_stack_ffffffffffffffc8);
    in_RDI->worker_id = uVar1;
    psVar2 = std::exchange<parlay::scheduler<parlay::WorkStealingJob>*,decltype(nullptr)>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_RDI->my_scheduler = psVar2;
  }
  return in_RDI;
}

Assistant:

workerInfo& operator=(workerInfo&& w) noexcept {
      if (this != &w) {
        worker_id = std::exchange(w.worker_id, UNINITIALIZED);
        my_scheduler = std::exchange(w.my_scheduler, nullptr);
      }
      return *this;
    }